

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive_ConcatToCompound
          (JavascriptString *this,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  charcount_t cVar4;
  charcount_t lenRight;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  JavascriptString *s;
  char16_t *pcVar7;
  char16_t *local_60;
  CompoundString *cs;
  ConcatString *leftLeftConcatString;
  JavascriptString *leftLeftString;
  ConcatString *leftConcatString;
  JavascriptString *pstRight_local;
  JavascriptString *this_local;
  
  bVar2 = VirtualTableInfo<Js::ConcatString>::HasVirtualTable(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1d5,"(VirtualTableInfo<ConcatString>::HasVirtualTable(this))",
                                "VirtualTableInfo<ConcatString>::HasVirtualTable(this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1d6,"(pstRight)","pstRight");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pJVar6 = ConcatString::LeftString((ConcatString *)this);
  bVar2 = VirtualTableInfo<Js::ConcatString>::HasVirtualTable(pJVar6);
  if (bVar2) {
    scriptContext = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
    cVar4 = GetLength(this);
    lenRight = GetLength(pstRight);
    StringProfiler::RecordConcatenation(scriptContext,cVar4,lenRight,ConcatType_CompoundString);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,StringConcatPhase);
    if (bVar2) {
      bVar2 = IsFinalized(pstRight);
      if (bVar2) {
        local_60 = GetString(pstRight);
      }
      else {
        local_60 = L"";
      }
      bVar3 = IsFinalized(pstRight);
      bVar2 = true;
      if (bVar3) {
        cVar4 = GetLength(pstRight);
        bVar2 = 8 < cVar4;
      }
      pcVar7 = L"";
      if (bVar2) {
        pcVar7 = L"...";
      }
      Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - converting ConcatString to CompoundString\n"
                    ,local_60,pcVar7);
      Output::Flush();
    }
    pJVar6 = ConcatString::LeftString((ConcatString *)this);
    library = RecyclableObject::GetLibrary(&this->super_RecyclableObject);
    this_local = (JavascriptString *)CompoundString::NewWithPointerCapacity(8,library);
    s = ConcatString::LeftString((ConcatString *)pJVar6);
    CompoundString::Append((CompoundString *)this_local,s);
    pJVar6 = ConcatString::RightString((ConcatString *)pJVar6);
    CompoundString::Append((CompoundString *)this_local,pJVar6);
    pJVar6 = ConcatString::RightString((ConcatString *)this);
    CompoundString::Append((CompoundString *)this_local,pJVar6);
    CompoundString::Append((CompoundString *)this_local,pstRight);
  }
  else {
    this_local = (JavascriptString *)0x0;
  }
  return this_local;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive_ConcatToCompound(JavascriptString* pstRight)
    {
        Assert(VirtualTableInfo<ConcatString>::HasVirtualTable(this));
        Assert(pstRight);

        const ConcatString *const leftConcatString = static_cast<const ConcatString *>(this);
        JavascriptString *const leftLeftString = leftConcatString->LeftString();
        if(VirtualTableInfo<ConcatString>::HasVirtualTable(leftLeftString))
        {
#ifdef PROFILE_STRINGS
            StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength(), ConcatType_CompoundString);
#endif
            if(PHASE_TRACE_StringConcat)
            {
                Output::Print(
                    _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - converting ConcatString to CompoundString\n"),
                    pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                    !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
                Output::Flush();
            }

            const ConcatString *const leftLeftConcatString = static_cast<const ConcatString *>(leftConcatString->LeftString());
            CompoundString *const cs = CompoundString::NewWithPointerCapacity(8, GetLibrary());
            cs->Append(leftLeftConcatString->LeftString());
            cs->Append(leftLeftConcatString->RightString());
            cs->Append(leftConcatString->RightString());
            cs->Append(pstRight);
            return cs;
        }
        return nullptr;
    }